

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniFile.cpp
# Opt level: O3

String * __thiscall asl::IniFile::operator[](IniFile *this,String *name)

{
  int j;
  Map<asl::String,_asl::String> *pMVar1;
  String *pSVar2;
  String sec;
  String local_50;
  String local_38;
  
  j = String::indexOf(name,'/',0);
  if (-1 < j) {
    String::substring(&local_38,name,0,j);
    pMVar1 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                        ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&local_38)->
              super_Map<asl::String,_asl::String>;
    String::substring(&local_50,name,j + 1,name->_len);
    pSVar2 = Map<asl::String,_asl::String>::operator[](pMVar1,&local_50);
    if (local_50._size != 0) {
      free(local_50.field_2._str);
    }
    if (local_38._size != 0) {
      free(local_38.field_2._str);
    }
    return pSVar2;
  }
  pMVar1 = &Map<asl::String,_asl::Dic<asl::String>_>::operator[]
                      ((Map<asl::String,_asl::Dic<asl::String>_> *)this,&this->_currentTitle)->
            super_Map<asl::String,_asl::String>;
  pSVar2 = Map<asl::String,_asl::String>::operator[](pMVar1,name);
  return pSVar2;
}

Assistant:

String& IniFile::operator[](const String& name)
{
	int slash = name.indexOf('/');
	if(slash < 0)
	{
		return _sections[_currentTitle][name];
	}
	else
	{
		String sec = name.substring(0, slash);
		Section& section = _sections[sec];
		return section[name.substring(slash + 1)];
	}
}